

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O0

void DrawStatus(player_t *CPlayer,int x,int y)

{
  bool bVar1;
  int iVar2;
  uint local_84;
  uint local_74;
  uint local_64;
  char local_58 [8];
  char tempstr [50];
  int local_18;
  int local_14;
  int y_local;
  int x_local;
  player_t *CPlayer_local;
  
  local_18 = y;
  local_14 = x;
  _y_local = CPlayer;
  bVar1 = FBoolCVar::operator_cast_to_bool(&hud_showscore);
  if (bVar1) {
    mysnprintf(local_58,0x32,"%i ",(ulong)(uint)(_y_local->mo->super_AActor).Score);
    DrawStatLine(local_14,&local_18,"Sc:",local_58);
  }
  bVar1 = FBoolCVar::operator_cast_to_bool(&hud_showstats);
  if (bVar1) {
    mysnprintf(local_58,0x32,"%i ",(ulong)(uint)(_y_local->mo->super_AActor).accuracy);
    DrawStatLine(local_14,&local_18,"Ac:",local_58);
    mysnprintf(local_58,0x32,"%i ",(ulong)(uint)(_y_local->mo->super_AActor).stamina);
    DrawStatLine(local_14,&local_18,"St:",local_58);
  }
  iVar2 = FIntCVar::operator_cast_to_int(&deathmatch);
  if (iVar2 == 0) {
    bVar1 = FBoolCVar::operator_cast_to_bool(&hud_showsecrets);
    if (bVar1) {
      if ((multiplayer & 1U) == 0) {
        local_64 = level.found_secrets;
      }
      else {
        local_64 = _y_local->secretcount;
      }
      mysnprintf(local_58,0x32,"%i/%i ",(ulong)local_64,(ulong)(uint)level.total_secrets);
      DrawStatLine(local_14,&local_18,"S:",local_58);
    }
    bVar1 = FBoolCVar::operator_cast_to_bool(&hud_showitems);
    if (bVar1) {
      if ((multiplayer & 1U) == 0) {
        local_74 = level.found_items;
      }
      else {
        local_74 = _y_local->itemcount;
      }
      mysnprintf(local_58,0x32,"%i/%i ",(ulong)local_74,(ulong)(uint)level.total_items);
      DrawStatLine(local_14,&local_18,"I:",local_58);
    }
    bVar1 = FBoolCVar::operator_cast_to_bool(&hud_showmonsters);
    if (bVar1) {
      if ((multiplayer & 1U) == 0) {
        local_84 = level.killed_monsters;
      }
      else {
        local_84 = _y_local->killcount;
      }
      mysnprintf(local_58,0x32,"%i/%i ",(ulong)local_84,(ulong)(uint)level.total_monsters);
      DrawStatLine(local_14,&local_18,"K:",local_58);
    }
  }
  return;
}

Assistant:

static void DrawStatus(player_t * CPlayer, int x, int y)
{
	char tempstr[50];
	
	if (hud_showscore)
	{
		mysnprintf(tempstr, countof(tempstr), "%i ", CPlayer->mo->Score);
		DrawStatLine(x, y, "Sc:", tempstr);
	}
	
	if (hud_showstats)
	{
		mysnprintf(tempstr, countof(tempstr), "%i ", CPlayer->mo->accuracy);
		DrawStatLine(x, y, "Ac:", tempstr);
		mysnprintf(tempstr, countof(tempstr), "%i ", CPlayer->mo->stamina);
		DrawStatLine(x, y, "St:", tempstr);
	}
	
	if (!deathmatch)
	{
		// FIXME: ZDoom doesn't preserve the player's stat counters across hubs so this doesn't
		// work in cooperative hub games
		if (hud_showsecrets)
		{
			mysnprintf(tempstr, countof(tempstr), "%i/%i ", multiplayer? CPlayer->secretcount : level.found_secrets, level.total_secrets);
			DrawStatLine(x, y, "S:", tempstr);
		}
		
		if (hud_showitems)
		{
			mysnprintf(tempstr, countof(tempstr), "%i/%i ", multiplayer? CPlayer->itemcount : level.found_items, level.total_items);
			DrawStatLine(x, y, "I:", tempstr);
		}
		
		if (hud_showmonsters)
		{
			mysnprintf(tempstr, countof(tempstr), "%i/%i ", multiplayer? CPlayer->killcount : level.killed_monsters, level.total_monsters);
			DrawStatLine(x, y, "K:", tempstr);
		}
	}
}